

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

void __thiscall arangodb::velocypack::ArrayIterator::next(ArrayIterator *this)

{
  ValueLength VVar1;
  uint8_t *local_10;
  
  if (this->_position != this->_size) {
    this->_position = this->_position + 1;
    local_10 = this->_current;
    VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_10);
    this->_current = this->_current + VVar1;
  }
  return;
}

Assistant:

[[nodiscard]] bool valid() const noexcept { return _position != _size; }